

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstsout.c
# Opt level: O2

void check_sysout(char *sysout_file_name,int verbose)

{
  int __fd;
  __off_t _Var1;
  ssize_t sVar2;
  ulong uVar3;
  char *pcVar4;
  IFPAGE ifpage;
  
  pcVar4 = (char *)&ifpage;
  __fd = open(sysout_file_name,0);
  if (__fd == -1) {
    sprintf((char *)&ifpage,"sysout_loader: can\'t open sysout file: %s",sysout_file_name);
  }
  else {
    _Var1 = lseek(__fd,0x200,0);
    if (_Var1 == -1) {
      pcVar4 = "sysout_loader: can\'t seek to IFPAGE";
    }
    else {
      sVar2 = read(__fd,&ifpage,0xb0);
      if (sVar2 != -1) {
        word_swap_page(&ifpage,0x2c);
        close(__fd);
        uVar3 = (ulong)ifpage.minbversion;
        if (verbose == 0) {
          pcVar4 = "%d";
        }
        else {
          printf("ifpage.minbversion %d\n",uVar3);
          printf("ifpage.process_size %d\n",(ulong)ifpage.process_size);
          printf("ifpage.storagefullstate %d\n",(ulong)ifpage.storagefullstate);
          uVar3 = (ulong)(uint)ifpage.nactivepages;
          pcVar4 = "ifpage.nactivepages %d\n";
        }
        printf(pcVar4,uVar3);
        return;
      }
      pcVar4 = "sysout_loader: can\'t read IFPAGE";
    }
  }
  perror(pcVar4);
  exit(-1);
}

Assistant:

void check_sysout(char *sysout_file_name, int verbose) {
  int sysout; /* SysoutFile descriptor */

  IFPAGE ifpage; /* IFPAGE */

  char errmsg[255];

  /*
   * first read the IFPAGE(InterfacePage)
   */

  /* open SysoutFile */
  sysout = open(sysout_file_name, O_RDONLY);
  if (sysout == -1) {
    sprintf(errmsg, "sysout_loader: can't open sysout file: %s", sysout_file_name);
    perror(errmsg);
    exit(-1);
  }
  /* seek to IFPAGE */
  if (lseek(sysout, IFPAGE_ADDRESS, SEEK_SET) == -1) {
    perror("sysout_loader: can't seek to IFPAGE");
    exit(-1);
  }
  /* reads IFPAGE into scratch_page */
  if (read(sysout, &ifpage, sizeof(IFPAGE)) == -1) {
    perror("sysout_loader: can't read IFPAGE");
    exit(-1);
  }

#ifdef BYTESWAP
  word_swap_page((unsigned short *)&ifpage, (3 + sizeof(IFPAGE)) / 4);
#endif
  close(sysout);
  if (verbose) {
      printf("ifpage.minbversion %d\n", ifpage.minbversion);
      printf("ifpage.process_size %d\n", ifpage.process_size);
      printf("ifpage.storagefullstate %d\n", ifpage.storagefullstate);
      printf("ifpage.nactivepages %d\n", ifpage.nactivepages);
  } else {
      printf("%d", ifpage.minbversion);
  }
}